

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

AV1_COMP *
av1_create_compressor
          (AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,BufferPool *pool,COMPRESSOR_STAGE stage,
          int lap_lag_in_frames)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int sharpness;
  aom_internal_error_info *paVar5;
  FRAME_CONTEXT *pFVar6;
  uint32_t *puVar7;
  uint8_t *puVar8;
  double *pdVar9;
  COMPRESSOR_STAGE in_CL;
  code *pcVar10;
  BufferPool *in_RDX;
  long in_RSI;
  AV1_PRIMARY *in_RDI;
  int in_R8D;
  DeltaQuantParams *prev_deltaq_params;
  int num_rows;
  int num_cols;
  int h;
  int w;
  BLOCK_SIZE bsize;
  int consec_zero_mv_alloc_size;
  int max_mi_rows;
  int max_mi_cols;
  int y;
  int x;
  int packets;
  size_t packet_sz;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  AV1_COMP *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  AV1_COMP *in_stack_ffffffffffffff80;
  AV1_COMMON *cm_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  aom_bit_depth_t bit_depth;
  undefined4 uVar11;
  int in_stack_ffffffffffffff9c;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  undefined4 in_stack_ffffffffffffffb0;
  AV1_COMP *local_8;
  
  local_8 = (AV1_COMP *)
            aom_memalign(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (size_t)in_stack_ffffffffffffff80);
  if (local_8 == (AV1_COMP *)0x0) {
    local_8 = (AV1_COMP *)0x0;
  }
  else {
    memset(local_8,0,0x9d710);
    local_8->ppi = in_RDI;
    (local_8->common).seq_params = &in_RDI->seq_params;
    paVar5 = (aom_internal_error_info *)
             aom_calloc(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (size_t)in_stack_ffffffffffffff70);
    (local_8->common).error = paVar5;
    if ((local_8->common).error == (aom_internal_error_info *)0x0) {
      aom_free(in_stack_ffffffffffffff70);
      local_8 = (AV1_COMP *)0x0;
    }
    else {
      iVar2 = _setjmp((__jmp_buf_tag *)((local_8->common).error)->jmp);
      if (iVar2 == 0) {
        ((local_8->common).error)->setjmp = 1;
        local_8->compressor_stage = in_CL;
        local_8->do_frame_data_update = true;
        (local_8->common).mi_params.free_mi = enc_free_mi;
        (local_8->common).mi_params.setup_mi = enc_setup_mi;
        iVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
        if (*(int *)(in_RSI + 0x438) != 1) {
          iVar2 = CONCAT13(local_8->compressor_stage == '\x01',(int3)in_stack_ffffffffffffff7c);
        }
        pcVar10 = enc_set_mb_mi;
        if ((char)((uint)iVar2 >> 0x18) != '\0') {
          pcVar10 = stat_stage_set_mb_mi;
        }
        (local_8->common).mi_params.set_mb_mi = pcVar10;
        (local_8->common).mi_params.mi_alloc_bsize = BLOCK_4X4;
        pFVar6 = (FRAME_CONTEXT *)
                 aom_memalign(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              (size_t)in_stack_ffffffffffffff80);
        (local_8->common).fc = pFVar6;
        if ((local_8->common).fc == (FRAME_CONTEXT *)0x0) {
          aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->fc"
                            );
        }
        pFVar6 = (FRAME_CONTEXT *)
                 aom_memalign(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              (size_t)in_stack_ffffffffffffff80);
        (local_8->common).default_frame_context = pFVar6;
        if ((local_8->common).default_frame_context == (FRAME_CONTEXT *)0x0) {
          aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cm->default_frame_context");
        }
        memset((local_8->common).fc,0,0x52fc);
        memset((local_8->common).default_frame_context,0,0x52fc);
        (local_8->common).buffer_pool = in_RDX;
        init_config(in_stack_ffffffffffffff80,
                    (AV1EncoderConfig *)CONCAT44(iVar2,in_stack_ffffffffffffff78));
        if (local_8->compressor_stage == '\x01') {
          (local_8->oxcf).gf_cfg.lag_in_frames = in_R8D;
        }
        av1_rc_init((AV1EncoderConfig *)in_stack_ffffffffffffff70,
                    (RATE_CONTROL *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        init_frame_info(&local_8->frame_info,&local_8->common);
        init_frame_index_set(&local_8->frame_index_set);
        (local_8->common).current_frame.frame_number = 0;
        (local_8->rc).frame_number_encoded = 0;
        (local_8->rc).prev_frame_is_dropped = 0;
        (local_8->rc).max_consec_drop = 0x7fffffff;
        (local_8->rc).drop_count_consec = 0;
        (local_8->common).current_frame_id = -1;
        local_8->tile_data = (TileDataEnc *)0x0;
        local_8->last_show_frame_buf = (RefCntBuffer *)0x0;
        realloc_segmentation_maps(in_stack_ffffffffffffff70);
        (local_8->refresh_frame).alt_ref_frame = false;
        (local_8->time_stamps).first_ts_start = 0x7fffffffffffffff;
        iVar3 = is_stat_consumption_stage(in_stack_ffffffffffffff70);
        if (iVar3 != 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(in_RSI + 0x108);
          iVar3 = SUB164(auVar1 / ZEXT816(0xe8),0);
          if (local_8->ppi->lap_enabled == 0) {
            ((local_8->ppi->twopass).stats_buf_ctx)->stats_in_start =
                 *(FIRSTPASS_STATS **)(in_RSI + 0x100);
            (local_8->twopass_frame).stats_in =
                 ((local_8->ppi->twopass).stats_buf_ctx)->stats_in_start;
            ((local_8->ppi->twopass).stats_buf_ctx)->stats_in_end =
                 ((local_8->ppi->twopass).stats_buf_ctx)->stats_in_start + (iVar3 + -1);
            av1_firstpass_info_init
                      ((FIRSTPASS_INFO *)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                       (FIRSTPASS_STATS *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
            av1_init_second_pass((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffb0));
          }
          else {
            av1_firstpass_info_init
                      ((FIRSTPASS_INFO *)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                       (FIRSTPASS_STATS *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
            av1_init_single_pass_lap(local_8);
          }
        }
        if ((local_8->oxcf).kf_cfg.key_freq_max != 0) {
          alloc_obmc_buffers((OBMCBuffer *)in_stack_ffffffffffffff70,
                             (aom_internal_error_info *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
          for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
            puVar7 = (uint32_t *)aom_malloc(0x22aa65);
            (local_8->td).mb.intrabc_hash_info.hash_value_buffer[iVar3][local_54] = puVar7;
            if ((local_8->td).mb.intrabc_hash_info.hash_value_buffer[iVar3][local_54] ==
                (uint32_t *)0x0) {
              aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y]"
                                );
            }
          }
        }
        (local_8->td).mb.intrabc_hash_info.g_crc_initialized = 0;
        av1_set_speed_features_framesize_independent
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
        av1_set_speed_features_framesize_dependent(in_stack_ffffffffffffff80,iVar2);
        local_58 = (local_8->common).mi_params.mi_cols;
        iVar3 = (local_8->common).mi_params.mi_rows;
        if (*(int *)(in_RSI + 0x20) != 0) {
          local_58 = size_in_mi(*(int *)(in_RSI + 0x20));
        }
        if (*(int *)(in_RSI + 0x24) != 0) {
          iVar3 = size_in_mi(*(int *)(in_RSI + 0x24));
        }
        iVar4 = iVar3 * local_58 >> 2;
        puVar8 = (uint8_t *)
                 aom_calloc(CONCAT44(iVar2,in_stack_ffffffffffffff78),
                            (size_t)in_stack_ffffffffffffff70);
        local_8->consec_zero_mv = puVar8;
        if (local_8->consec_zero_mv == (uint8_t *)0x0) {
          aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->consec_zero_mv");
        }
        local_8->consec_zero_mv_alloc_size = iVar4;
        local_8->mb_weber_stats = (WeberStats *)0x0;
        local_8->mb_delta_q = (int *)0x0;
        local_8->palette_pixel_num = 0;
        local_8->scaled_last_source_available = 0;
        uVar12 = CONCAT13(6,(int3)in_stack_ffffffffffffff9c);
        uVar11 = 4;
        bit_depth = 4;
        sharpness = (local_58 + 3) / 4;
        pdVar9 = (double *)
                 aom_calloc(CONCAT44(iVar2,in_stack_ffffffffffffff78),
                            (size_t)in_stack_ffffffffffffff70);
        local_8->ssim_rdmult_scaling_factors = pdVar9;
        if (local_8->ssim_rdmult_scaling_factors == (double *)0x0) {
          aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->ssim_rdmult_scaling_factors");
        }
        pdVar9 = (double *)
                 aom_calloc(CONCAT44(iVar2,in_stack_ffffffffffffff78),
                            (size_t)in_stack_ffffffffffffff70);
        local_8->tpl_rdmult_scaling_factors = pdVar9;
        if (local_8->tpl_rdmult_scaling_factors == (double *)0x0) {
          aom_internal_error((local_8->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cpi->tpl_rdmult_scaling_factors");
        }
        cm_00 = (AV1_COMMON *)&(local_8->enc_quant_dequant_params).prev_deltaq_params;
        ((DeltaQuantParams *)cm_00)->y_dc_delta_q = 0x7fffffff;
        (local_8->enc_quant_dequant_params).prev_deltaq_params.u_dc_delta_q = 0x7fffffff;
        (local_8->enc_quant_dequant_params).prev_deltaq_params.v_dc_delta_q = 0x7fffffff;
        (local_8->enc_quant_dequant_params).prev_deltaq_params.u_ac_delta_q = 0x7fffffff;
        (local_8->enc_quant_dequant_params).prev_deltaq_params.v_ac_delta_q = 0x7fffffff;
        av1_init_quantizer((EncQuantDequantParams *)CONCAT44(iVar3,iVar4),
                           (CommonQuantParams *)CONCAT44(uVar12,uVar11),bit_depth,sharpness);
        av1_num_planes(&local_8->common);
        av1_qm_init((CommonQuantParams *)cm_00,iVar2);
        av1_loop_filter_init(cm_00);
        (local_8->common).superres_scale_denominator = '\b';
        (local_8->common).superres_upscaled_width = *(int *)(in_RSI + 0x18);
        (local_8->common).superres_upscaled_height = *(int *)(in_RSI + 0x1c);
        av1_loop_restoration_precal();
        local_8->second_pass_log_stream = (FILE *)0x0;
        local_8->use_ducky_encode = 0;
        ((local_8->common).error)->setjmp = 0;
      }
      else {
        ((local_8->common).error)->setjmp = 0;
        av1_remove_compressor
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_8 = (AV1_COMP *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

AV1_COMP *av1_create_compressor(AV1_PRIMARY *ppi, const AV1EncoderConfig *oxcf,
                                BufferPool *const pool, COMPRESSOR_STAGE stage,
                                int lap_lag_in_frames) {
  AV1_COMP *volatile const cpi = aom_memalign(32, sizeof(AV1_COMP));

  if (!cpi) return NULL;

  av1_zero(*cpi);

  cpi->ppi = ppi;

  AV1_COMMON *volatile const cm = &cpi->common;
  cm->seq_params = &ppi->seq_params;
  cm->error =
      (struct aom_internal_error_info *)aom_calloc(1, sizeof(*cm->error));
  if (!cm->error) {
    aom_free(cpi);
    return NULL;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    av1_remove_compressor(cpi);
    return NULL;
  }

  cm->error->setjmp = 1;
  cpi->compressor_stage = stage;

  cpi->do_frame_data_update = true;

  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->free_mi = enc_free_mi;
  mi_params->setup_mi = enc_setup_mi;
  mi_params->set_mb_mi =
      (oxcf->pass == AOM_RC_FIRST_PASS || cpi->compressor_stage == LAP_STAGE)
          ? stat_stage_set_mb_mi
          : enc_set_mb_mi;

  mi_params->mi_alloc_bsize = BLOCK_4X4;

  CHECK_MEM_ERROR(cm, cm->fc,
                  (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->fc)));
  CHECK_MEM_ERROR(
      cm, cm->default_frame_context,
      (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->default_frame_context)));
  memset(cm->fc, 0, sizeof(*cm->fc));
  memset(cm->default_frame_context, 0, sizeof(*cm->default_frame_context));

  cpi->common.buffer_pool = pool;

  init_config(cpi, oxcf);
  if (cpi->compressor_stage == LAP_STAGE) {
    cpi->oxcf.gf_cfg.lag_in_frames = lap_lag_in_frames;
  }

  av1_rc_init(&cpi->oxcf, &cpi->rc);

  init_frame_info(&cpi->frame_info, cm);
  init_frame_index_set(&cpi->frame_index_set);

  cm->current_frame.frame_number = 0;
  cpi->rc.frame_number_encoded = 0;
  cpi->rc.prev_frame_is_dropped = 0;
  cpi->rc.max_consec_drop = INT_MAX;
  cpi->rc.drop_count_consec = 0;
  cm->current_frame_id = -1;
  cpi->tile_data = NULL;
  cpi->last_show_frame_buf = NULL;
  realloc_segmentation_maps(cpi);

  cpi->refresh_frame.alt_ref_frame = false;

#if CONFIG_SPEED_STATS
  cpi->tx_search_count = 0;
#endif  // CONFIG_SPEED_STATS

  cpi->time_stamps.first_ts_start = INT64_MAX;

#ifdef OUTPUT_YUV_REC
  yuv_rec_file = fopen("rec.yuv", "wb");
#endif
#ifdef OUTPUT_YUV_DENOISED
  yuv_denoised_file = fopen("denoised.yuv", "wb");
#endif

#if !CONFIG_REALTIME_ONLY
  if (is_stat_consumption_stage(cpi)) {
    const size_t packet_sz = sizeof(FIRSTPASS_STATS);
    const int packets = (int)(oxcf->twopass_stats_in.sz / packet_sz);

    if (!cpi->ppi->lap_enabled) {
      /*Re-initialize to stats buffer, populated by application in the case of
       * two pass*/
      cpi->ppi->twopass.stats_buf_ctx->stats_in_start =
          oxcf->twopass_stats_in.buf;
      cpi->twopass_frame.stats_in =
          cpi->ppi->twopass.stats_buf_ctx->stats_in_start;
      cpi->ppi->twopass.stats_buf_ctx->stats_in_end =
          &cpi->ppi->twopass.stats_buf_ctx->stats_in_start[packets - 1];

      // The buffer size is packets - 1 because the last packet is total_stats.
      av1_firstpass_info_init(&cpi->ppi->twopass.firstpass_info,
                              oxcf->twopass_stats_in.buf, packets - 1);
      av1_init_second_pass(cpi);
    } else {
      av1_firstpass_info_init(&cpi->ppi->twopass.firstpass_info, NULL, 0);
      av1_init_single_pass_lap(cpi);
    }
  }
#endif

  // The buffer "obmc_buffer" is used in inter frames for fast obmc search.
  // Hence, the memory allocation for the same is avoided for allintra encoding
  // mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0)
    alloc_obmc_buffers(&cpi->td.mb.obmc_buffer, cm->error);

  for (int x = 0; x < 2; x++)
    for (int y = 0; y < 2; y++)
      CHECK_MEM_ERROR(
          cm, cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y],
          (uint32_t *)aom_malloc(
              AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
              sizeof(*cpi->td.mb.intrabc_hash_info.hash_value_buffer[0][0])));

  cpi->td.mb.intrabc_hash_info.g_crc_initialized = 0;

  av1_set_speed_features_framesize_independent(cpi, oxcf->speed);
  av1_set_speed_features_framesize_dependent(cpi, oxcf->speed);

  int max_mi_cols = mi_params->mi_cols;
  int max_mi_rows = mi_params->mi_rows;
  if (oxcf->frm_dim_cfg.forced_max_frame_width) {
    max_mi_cols = size_in_mi(oxcf->frm_dim_cfg.forced_max_frame_width);
  }
  if (oxcf->frm_dim_cfg.forced_max_frame_height) {
    max_mi_rows = size_in_mi(oxcf->frm_dim_cfg.forced_max_frame_height);
  }

  const int consec_zero_mv_alloc_size = (max_mi_rows * max_mi_cols) >> 2;
  CHECK_MEM_ERROR(
      cm, cpi->consec_zero_mv,
      aom_calloc(consec_zero_mv_alloc_size, sizeof(*cpi->consec_zero_mv)));
  cpi->consec_zero_mv_alloc_size = consec_zero_mv_alloc_size;

  cpi->mb_weber_stats = NULL;
  cpi->mb_delta_q = NULL;
  cpi->palette_pixel_num = 0;
  cpi->scaled_last_source_available = 0;

  {
    const BLOCK_SIZE bsize = BLOCK_16X16;
    const int w = mi_size_wide[bsize];
    const int h = mi_size_high[bsize];
    const int num_cols = (max_mi_cols + w - 1) / w;
    const int num_rows = (max_mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(cm, cpi->ssim_rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->ssim_rdmult_scaling_factors)));
    CHECK_MEM_ERROR(cm, cpi->tpl_rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->tpl_rdmult_scaling_factors)));
  }

#if CONFIG_TUNE_VMAF
  {
    const BLOCK_SIZE bsize = BLOCK_64X64;
    const int w = mi_size_wide[bsize];
    const int h = mi_size_high[bsize];
    const int num_cols = (mi_params->mi_cols + w - 1) / w;
    const int num_rows = (mi_params->mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(cm, cpi->vmaf_info.rdmult_scaling_factors,
                    aom_calloc(num_rows * num_cols,
                               sizeof(*cpi->vmaf_info.rdmult_scaling_factors)));
    for (int i = 0; i < MAX_ARF_LAYERS; i++) {
      cpi->vmaf_info.last_frame_unsharp_amount[i] = -1.0;
      cpi->vmaf_info.last_frame_ysse[i] = -1.0;
      cpi->vmaf_info.last_frame_vmaf[i] = -1.0;
    }
    cpi->vmaf_info.original_qindex = -1;
    cpi->vmaf_info.vmaf_model = NULL;
  }
#endif

#if CONFIG_TUNE_BUTTERAUGLI
  {
    const int w = mi_size_wide[butteraugli_rdo_bsize];
    const int h = mi_size_high[butteraugli_rdo_bsize];
    const int num_cols = (mi_params->mi_cols + w - 1) / w;
    const int num_rows = (mi_params->mi_rows + h - 1) / h;
    CHECK_MEM_ERROR(
        cm, cpi->butteraugli_info.rdmult_scaling_factors,
        aom_malloc(num_rows * num_cols *
                   sizeof(*cpi->butteraugli_info.rdmult_scaling_factors)));
    memset(&cpi->butteraugli_info.source, 0,
           sizeof(cpi->butteraugli_info.source));
    memset(&cpi->butteraugli_info.resized_source, 0,
           sizeof(cpi->butteraugli_info.resized_source));
    cpi->butteraugli_info.recon_set = false;
  }
#endif

#if CONFIG_SALIENCY_MAP
  {
    CHECK_MEM_ERROR(cm, cpi->saliency_map,
                    (uint8_t *)aom_calloc(cm->height * cm->width,
                                          sizeof(*cpi->saliency_map)));
    // Buffer initialization based on MIN_MIB_SIZE_LOG2 to ensure that
    // cpi->sm_scaling_factor buffer is allocated big enough, since we have no
    // idea of the actual superblock size we are going to use yet.
    const int min_mi_w_sb = (1 << MIN_MIB_SIZE_LOG2);
    const int min_mi_h_sb = (1 << MIN_MIB_SIZE_LOG2);
    const int max_sb_cols =
        (cm->mi_params.mi_cols + min_mi_w_sb - 1) / min_mi_w_sb;
    const int max_sb_rows =
        (cm->mi_params.mi_rows + min_mi_h_sb - 1) / min_mi_h_sb;
    CHECK_MEM_ERROR(cm, cpi->sm_scaling_factor,
                    (double *)aom_calloc(max_sb_rows * max_sb_cols,
                                         sizeof(*cpi->sm_scaling_factor)));
  }
#endif

#if CONFIG_COLLECT_PARTITION_STATS
  av1_zero(cpi->partition_stats);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Initialize the members of DeltaQuantParams with INT_MAX to ensure that
  // the quantizer tables are correctly initialized using the default deltaq
  // parameters when av1_init_quantizer is called for the first time.
  DeltaQuantParams *const prev_deltaq_params =
      &cpi->enc_quant_dequant_params.prev_deltaq_params;
  prev_deltaq_params->y_dc_delta_q = INT_MAX;
  prev_deltaq_params->u_dc_delta_q = INT_MAX;
  prev_deltaq_params->v_dc_delta_q = INT_MAX;
  prev_deltaq_params->u_ac_delta_q = INT_MAX;
  prev_deltaq_params->v_ac_delta_q = INT_MAX;

  av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                     cm->seq_params->bit_depth, cpi->oxcf.algo_cfg.sharpness);
  av1_qm_init(&cm->quant_params, av1_num_planes(cm));

  av1_loop_filter_init(cm);
  cm->superres_scale_denominator = SCALE_NUMERATOR;
  cm->superres_upscaled_width = oxcf->frm_dim_cfg.width;
  cm->superres_upscaled_height = oxcf->frm_dim_cfg.height;
#if !CONFIG_REALTIME_ONLY
  av1_loop_restoration_precal();
#endif

#if CONFIG_THREE_PASS
  cpi->third_pass_ctx = NULL;
  if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
    av1_init_thirdpass_ctx(cm, &cpi->third_pass_ctx, NULL);
  }
#endif

  cpi->second_pass_log_stream = NULL;
  cpi->use_ducky_encode = 0;

  cm->error->setjmp = 0;
  return cpi;
}